

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

int Wlc_NtkMuxTree2(Gia_Man_t *pNew,int *pCtrl,int nCtrl,Vec_Int_t *vData,Vec_Int_t *vAnds,
                   Vec_Int_t *vTemp)

{
  int iVar1;
  int iLit1;
  int iVar2;
  
  if (nCtrl != 0) {
    if (vData->nSize != 1 << ((byte)nCtrl & 0x1f)) {
      __assert_fail("!nCtrl || Vec_IntSize(vData) == (1 << nCtrl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                    ,0x7f,
                    "int Wlc_NtkMuxTree2(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    if (vAnds->nSize != vData->nSize) {
      __assert_fail("!nCtrl || Vec_IntSize(vAnds) == (1 << nCtrl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                    ,0x80,
                    "int Wlc_NtkMuxTree2(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
  }
  vTemp->nSize = 0;
  for (iVar2 = 0; iVar2 < vAnds->nSize; iVar2 = iVar2 + 1) {
    iVar1 = Vec_IntEntry(vAnds,iVar2);
    iLit1 = Vec_IntEntry(vData,iVar2);
    iVar1 = Gia_ManHashAnd(pNew,iVar1,iLit1);
    iVar1 = Abc_LitNot(iVar1);
    Vec_IntPush(vTemp,iVar1);
  }
  iVar2 = Gia_ManHashAndMulti(pNew,vTemp);
  iVar2 = Abc_LitNot(iVar2);
  return iVar2;
}

Assistant:

int Wlc_NtkMuxTree2( Gia_Man_t * pNew, int * pCtrl, int nCtrl, Vec_Int_t * vData, Vec_Int_t * vAnds, Vec_Int_t * vTemp )
{
    int m, iLit;
    assert( !nCtrl || Vec_IntSize(vData) == (1 << nCtrl) );
    assert( !nCtrl || Vec_IntSize(vAnds) == (1 << nCtrl) );
    Vec_IntClear( vTemp );
    Vec_IntForEachEntry( vAnds, iLit, m )
        Vec_IntPush( vTemp, Abc_LitNot( Gia_ManHashAnd(pNew, iLit, Vec_IntEntry(vData, m)) ) );
    return Abc_LitNot( Gia_ManHashAndMulti(pNew, vTemp) );
}